

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void cmsys::SystemTools::AddTranslationPath(string *a,string *b)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  size_type sVar6;
  size_type sVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  string path_b;
  string path_a;
  string local_b0;
  string local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  paVar1 = &local_90.field_2;
  pcVar5 = (a->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar5,pcVar5 + a->_M_string_length)
  ;
  paVar2 = &local_b0.field_2;
  pcVar5 = (b->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar5,pcVar5 + b->_M_string_length)
  ;
  ConvertToUnixSlashes(&local_90);
  ConvertToUnixSlashes(&local_b0);
  bVar8 = FileIsDirectory(&local_90);
  if (((bVar8) && (local_b0._M_string_length != 0)) &&
     ((*local_b0._M_dataplus._M_p == '~' || (*local_b0._M_dataplus._M_p == '/')))) {
    lVar10 = std::__cxx11::string::find((char *)&local_b0,0x505838,0);
    if (lVar10 == -1) {
      if ((local_90._M_string_length != 0) &&
         (local_90._M_dataplus._M_p[local_90._M_string_length - 1] != '/')) {
        std::__cxx11::string::push_back((char)&local_90);
      }
      if ((local_b0._M_string_length != 0) &&
         (local_b0._M_dataplus._M_p[local_b0._M_string_length - 1] != '/')) {
        std::__cxx11::string::push_back((char)&local_b0);
      }
      sVar7 = local_90._M_string_length;
      sVar6 = local_b0._M_string_length;
      if (local_90._M_string_length == local_b0._M_string_length) {
        if (local_90._M_string_length == 0) goto LAB_003a5fff;
        iVar9 = bcmp(local_90._M_dataplus._M_p,local_b0._M_dataplus._M_p,local_90._M_string_length);
        if (iVar9 == 0) goto LAB_003a5fff;
      }
      paVar3 = &local_70.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == paVar1) {
        local_70.first.field_2._8_8_ = local_90.field_2._8_8_;
        local_70.first._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_70.first._M_dataplus._M_p = local_90._M_dataplus._M_p;
      }
      local_70.first.field_2._M_allocated_capacity._1_7_ =
           local_90.field_2._M_allocated_capacity._1_7_;
      local_70.first.field_2._M_local_buf[0] = local_90.field_2._M_local_buf[0];
      paVar4 = &local_70.second.field_2;
      local_70.first._M_string_length = sVar7;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar2) {
        local_70.second.field_2._8_8_ = local_b0.field_2._8_8_;
        local_70.second._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_70.second._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      }
      local_70.second.field_2._M_allocated_capacity._1_7_ =
           local_b0.field_2._M_allocated_capacity._1_7_;
      local_70.second.field_2._M_local_buf[0] = local_b0.field_2._M_local_buf[0];
      local_70.second._M_string_length = sVar6;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                (Statics,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.second._M_dataplus._M_p != paVar4) {
        operator_delete(local_70.second._M_dataplus._M_p,
                        local_70.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.first._M_dataplus._M_p != paVar3) {
        operator_delete(local_70.first._M_dataplus._M_p,
                        local_70.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_003a5fff:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void SystemTools::AddTranslationPath(const std::string& a,
                                     const std::string& b)
{
  std::string path_a = a;
  std::string path_b = b;
  SystemTools::ConvertToUnixSlashes(path_a);
  SystemTools::ConvertToUnixSlashes(path_b);
  // First check this is a directory path, since we don't want the table to
  // grow too fat
  if (SystemTools::FileIsDirectory(path_a)) {
    // Make sure the path is a full path and does not contain no '..'
    // Ken--the following code is incorrect. .. can be in a valid path
    // for example  /home/martink/MyHubba...Hubba/Src
    if (SystemTools::FileIsFullPath(path_b) &&
        path_b.find("..") == std::string::npos) {
      // Before inserting make sure path ends with '/'
      if (!path_a.empty() && path_a.back() != '/') {
        path_a += '/';
      }
      if (!path_b.empty() && path_b.back() != '/') {
        path_b += '/';
      }
      if (!(path_a == path_b)) {
        SystemTools::Statics->TranslationMap.insert(
          SystemToolsStatic::StringMap::value_type(std::move(path_a),
                                                   std::move(path_b)));
      }
    }
  }
}